

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O1

void Fxu_ListMatrixAddVariable(Fxu_Matrix *p,Fxu_Var *pLink)

{
  int *piVar1;
  Fxu_Var *pFVar2;
  
  if ((p->lVars).pHead == (Fxu_Var *)0x0) {
    (p->lVars).pHead = pLink;
    (p->lVars).pTail = pLink;
    pLink->pPrev = (Fxu_Var *)0x0;
    pLink->pNext = (Fxu_Var *)0x0;
  }
  else {
    pLink->pNext = (Fxu_Var *)0x0;
    pFVar2 = (p->lVars).pTail;
    pFVar2->pNext = pLink;
    pLink->pPrev = pFVar2;
    (p->lVars).pTail = pLink;
  }
  piVar1 = &(p->lVars).nItems;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

// matrix -> var

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Fxu_ListMatrixAddVariable( Fxu_Matrix * p, Fxu_Var * pLink ) 
{
	Fxu_ListVar * pList = &p->lVars;
	if ( pList->pHead == NULL )
	{
		pList->pHead = pLink;
		pList->pTail = pLink;
		pLink->pPrev = NULL;
		pLink->pNext = NULL;
	}
	else
	{
		pLink->pNext = NULL;
		pList->pTail->pNext = pLink;
		pLink->pPrev = pList->pTail;
		pList->pTail = pLink;
	}
	pList->nItems++;
}